

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O2

bool __thiscall
ithipublisher::PrintNameList
          (ithipublisher *this,FILE *F,
          vector<_metric_name_line,_std::allocator<_metric_name_line>_> *name_list,double mult)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  pointer p_Var4;
  long lVar5;
  size_t i;
  ulong uVar6;
  
  bVar1 = true;
  lVar5 = 0x10;
  uVar6 = 0;
  while( true ) {
    if (!bVar1) {
      return bVar1;
    }
    p_Var4 = (name_list->super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(name_list->
                  super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>)._M_impl
                  .super__Vector_impl_data._M_finish - (long)p_Var4;
    if ((ulong)(lVar3 / 0x18) <= uVar6) break;
    if (uVar6 != 0) {
      iVar2 = fprintf((FILE *)F,",\n",lVar3 % 0x18);
      bVar1 = 0 < iVar2;
      p_Var4 = (name_list->super__Vector_base<_metric_name_line,_std::allocator<_metric_name_line>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    iVar2 = fprintf((FILE *)F,"[\"%s\", %8f, %8f]",*(double *)((long)p_Var4 + lVar5 + -8) * mult,
                    *(double *)((long)&p_Var4->name + lVar5) * mult,
                    *(undefined8 *)((long)p_Var4 + lVar5 + -0x10));
    bVar1 = bVar1 != false && 0 < iVar2;
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x18;
  }
  return bVar1;
}

Assistant:

bool ithipublisher::PrintNameList(FILE * F, std::vector<MetricNameLine>* name_list, double mult)
{
    bool ret = true;

    for (size_t i = 0; ret && i < name_list->size(); i++)
    {
        if (i != 0)
        {
            ret = fprintf(F, ",\n") > 0;
        }
        ret &= (fprintf(F, "[\"%s\", %8f, %8f]", 
            (*name_list)[i].name, mult * (*name_list)[i].current, mult * (*name_list)[i].average) > 0);
    }

    return ret;
}